

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O1

string_view __thiscall
cinatra::coro_http_request::get_header_value(coro_http_request *this,string_view key)

{
  char cVar1;
  http_parser *phVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  array<cinatra::http_header,_100UL> *paVar8;
  size_t sVar9;
  difference_type __d1;
  bool bVar10;
  string_view sVar11;
  difference_type __d2;
  
  phVar2 = this->parser_;
  sVar6 = phVar2->num_headers_;
  if (sVar6 == 0) {
    pcVar7 = (char *)0x0;
    sVar6 = 0;
  }
  else {
    paVar8 = &phVar2->headers_;
    do {
      sVar3 = paVar8->_M_elems[0].name._M_len;
      if (sVar3 == key._M_len) {
        bVar10 = sVar3 == 0;
        if (bVar10) {
LAB_0015c946:
          if (bVar10) {
            sVar6 = paVar8->_M_elems[0].value._M_len;
            pcVar7 = paVar8->_M_elems[0].value._M_str;
            goto LAB_0015c969;
          }
        }
        else {
          pcVar7 = paVar8->_M_elems[0].name._M_str;
          cVar1 = *key._M_str;
          iVar4 = tolower((int)*pcVar7);
          iVar5 = tolower((int)cVar1);
          if (iVar4 == iVar5) {
            sVar9 = 1;
            do {
              bVar10 = sVar3 == sVar9;
              if (bVar10) goto LAB_0015c946;
              cVar1 = key._M_str[sVar9];
              iVar4 = tolower((int)pcVar7[sVar9]);
              iVar5 = tolower((int)cVar1);
              sVar9 = sVar9 + 1;
            } while (iVar4 == iVar5);
          }
        }
      }
      paVar8 = (array<cinatra::http_header,_100UL> *)(paVar8->_M_elems + 1);
    } while ((http_header *)paVar8 != (phVar2->headers_)._M_elems + sVar6);
    sVar6 = 0;
    pcVar7 = (char *)0x0;
  }
LAB_0015c969:
  sVar11._M_str = pcVar7;
  sVar11._M_len = sVar6;
  return sVar11;
}

Assistant:

std::string_view get_header_value(std::string_view key) {
    auto headers = parser_.get_headers();
    for (auto &header : headers) {
      if (iequal0(header.name, key)) {
        return header.value;
      }
    }

    return {};
  }